

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

bool __thiscall GB::CheckDiv(GB *this,u16 old_div,u16 new_div,u8 old_tac,u8 new_tac)

{
  u8 *puVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = (CheckDiv::tima_mask[new_tac & 3] & new_div) == 0;
  bVar3 = (CheckDiv::tima_mask[old_tac & 3] & old_div) != 0;
  if (bVar3 && bVar2) {
    puVar1 = (this->s).io + 5;
    *puVar1 = *puVar1 + '\x01';
    if (*puVar1 == '\0') {
      (this->s).tima_overflow_tick = (this->s).tick;
    }
  }
  return bVar3 && bVar2;
}

Assistant:

bool GB::CheckDiv(u16 old_div, u16 new_div, u8 old_tac, u8 new_tac) {
  static const u16 tima_mask[] = {1 << 9, 1 << 3, 1 << 5, 1 << 7};
  bool old_bit = old_div & tima_mask[old_tac & 3];
  bool bit = new_div & tima_mask[new_tac & 3];
  if (old_bit != bit && !bit) {
    DPRINT(TIMER, "++tima: %02x->%02x\n", s.io[TIMA], (s.io[TIMA] + 1) & 0xff);
    if (++s.io[TIMA] == 0) {
      DPRINT(TIMER, "tima overflow, div:%04x->%04x tac:%02x->%02x\n", old_div,
             new_div, old_tac, new_tac);
      s.tima_overflow_tick = s.tick;
    }
    return true;
  }
  return false;
}